

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

void __thiscall cdns::cdns(cdns *this)

{
  cdnsPreamble::cdnsPreamble(&this->preamble);
  (this->block).statistics.unmatched_queries = 0;
  (this->block).statistics.unmatched_responses = 0;
  (this->block).statistics.discarded_opcode = 0;
  (this->block).statistics.malformed_items = 0;
  (this->block).statistics.current_block = (cdnsBlock *)0x0;
  (this->block).statistics.processed_messages = 0;
  (this->block).statistics.qr_data_items = 0;
  (this->block).statistics.is_filled = false;
  memset(&(this->block).tables,0,0xc9);
  (this->block).current_cdns = (cdns *)0x0;
  (this->block).preamble.current_block = (cdnsBlock *)0x0;
  (this->block).preamble.earliest_time_sec = 0;
  (this->block).preamble.earliest_time_usec = 0;
  *(undefined8 *)((long)&(this->block).preamble.earliest_time_usec + 1) = 0;
  *(undefined8 *)((long)&(this->block).preamble.block_parameter_index + 1) = 0;
  (this->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block).queries.super__Vector_base<cdns_query,_std::allocator<cdns_query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->block).address_events.
  super__Vector_base<cdns_address_event_count,_std::allocator<cdns_address_event_count>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->block).address_events.
  super__Vector_base<cdns_address_event_count,_std::allocator<cdns_address_event_count>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->block).address_events.
  super__Vector_base<cdns_address_event_count,_std::allocator<cdns_address_event_count>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->block).is_filled = 0;
  (this->block).block_start_us = 0;
  this->first_block_start_us = 0;
  this->index_offset = 0;
  this->buf = (uint8_t *)0x0;
  this->buf_size = 0;
  this->buf_read = 0;
  this->buf_parsed = 0;
  this->end_of_file = false;
  this->preamble_parsed = false;
  this->file_head_undef = false;
  this->block_list_undef = false;
  this->nb_blocks_present = 0;
  this->nb_blocks_read = 0;
  return;
}

Assistant:

cdns::cdns():
    first_block_start_us(0),
    index_offset(0),
    buf(NULL),
    buf_size(0),
    buf_read(0),
    buf_parsed(0),
    end_of_file(false),
    preamble_parsed(false),
    file_head_undef(false),
    block_list_undef(false),
    nb_blocks_present(0),
    nb_blocks_read(0)
{
}